

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.h
# Opt level: O1

int __thiscall
rlib::sequencer::MmlCompiler::EventPitchBend::clone
          (EventPitchBend *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x28);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_0016be90;
  puVar1[2] = &PTR__Event_0016bc18;
  puVar1[3] = *(undefined8 *)(__fn + 8);
  puVar1[2] = &PTR__Event_0016bee0;
  *(undefined2 *)(puVar1 + 4) = *(undefined2 *)(__fn + 0x10);
  (this->super_Event)._vptr_Event = (_func_int **)(puVar1 + 2);
  (this->super_Event).position = (size_t)puVar1;
  return (int)this;
}

Assistant:

virtual std::shared_ptr<Event> clone()const {
				return std::make_shared<EventPitchBend>(*this);
			}